

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall SQCompilation::CheckerVisitor::visitIncExpr(CheckerVisitor *this,IncExpr *expr)

{
  SQChar *ref;
  ValueRef *pVVar1;
  Expr *lhs;
  SQChar buffer [64];
  SQChar local_68 [72];
  
  local_68[0x30] = '\0';
  local_68[0x31] = '\0';
  local_68[0x32] = '\0';
  local_68[0x33] = '\0';
  local_68[0x34] = '\0';
  local_68[0x35] = '\0';
  local_68[0x36] = '\0';
  local_68[0x37] = '\0';
  local_68[0x38] = '\0';
  local_68[0x39] = '\0';
  local_68[0x3a] = '\0';
  local_68[0x3b] = '\0';
  local_68[0x3c] = '\0';
  local_68[0x3d] = '\0';
  local_68[0x3e] = '\0';
  local_68[0x3f] = '\0';
  local_68[0x20] = '\0';
  local_68[0x21] = '\0';
  local_68[0x22] = '\0';
  local_68[0x23] = '\0';
  local_68[0x24] = '\0';
  local_68[0x25] = '\0';
  local_68[0x26] = '\0';
  local_68[0x27] = '\0';
  local_68[0x28] = '\0';
  local_68[0x29] = '\0';
  local_68[0x2a] = '\0';
  local_68[0x2b] = '\0';
  local_68[0x2c] = '\0';
  local_68[0x2d] = '\0';
  local_68[0x2e] = '\0';
  local_68[0x2f] = '\0';
  local_68[0x10] = '\0';
  local_68[0x11] = '\0';
  local_68[0x12] = '\0';
  local_68[0x13] = '\0';
  local_68[0x14] = '\0';
  local_68[0x15] = '\0';
  local_68[0x16] = '\0';
  local_68[0x17] = '\0';
  local_68[0x18] = '\0';
  local_68[0x19] = '\0';
  local_68[0x1a] = '\0';
  local_68[0x1b] = '\0';
  local_68[0x1c] = '\0';
  local_68[0x1d] = '\0';
  local_68[0x1e] = '\0';
  local_68[0x1f] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  for (lhs = expr->_arg; lhs != (Expr *)0x0;
      lhs = (Expr *)lhs[1].super_Node.super_ArenaObj._vptr_ArenaObj) {
    if ((lhs->super_Node)._op != TO_PAREN) goto LAB_00152fd2;
  }
  lhs = (Expr *)0x0;
LAB_00152fd2:
  ref = computeNameRef(this,lhs,local_68,0x40);
  if (ref != (SQChar *)0x0) {
    pVVar1 = findValueInScopes(this,ref);
    if (pVVar1 != (ValueRef *)0x0) {
      if (this->currentInfo != (FunctionInfo *)0x0) {
        FunctionInfo::addModifiable(this->currentInfo,ref,pVVar1->info->ownedScope->owner);
      }
      pVVar1->expression = (Expr *)0x0;
      pVVar1->state = VRS_MULTIPLE;
      pVVar1->flagsPositive = 0;
      pVVar1->flagsNegative = 0;
      (pVVar1->upperBound).kind = VBK_UNKNOWN;
      (pVVar1->lowerBound).kind = VBK_UNKNOWN;
    }
  }
  (*(this->super_Visitor)._vptr_Visitor[3])(this,expr);
  return;
}

Assistant:

void CheckerVisitor::visitIncExpr(IncExpr *expr) {

  SQChar buffer[64] = { 0 };
  const SQChar *name = computeNameRef(deparen(expr->argument()), buffer, sizeof buffer);
  if (name) {
    ValueRef *v = findValueInScopes(name);

    if (v) {
      if (currentInfo) {
        currentInfo->addModifiable(name, v->info->ownedScope->owner);
      }

      v->expression = nullptr;
      v->state = VRS_MULTIPLE;
      v->flagsNegative = v->flagsPositive = 0;
      v->lowerBound.kind = v->upperBound.kind = VBK_UNKNOWN;
    }
  }

  Visitor::visitIncExpr(expr);
}